

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalogManager.cpp
# Opt level: O0

int __thiscall catalog::existTable(catalog *this,string *tableName)

{
  __type _Var1;
  reference ppTVar2;
  int local_24;
  int i;
  string *tableName_local;
  catalog *this_local;
  
  local_24 = 0;
  while( true ) {
    if (this->tableNumber <= local_24) {
      return -1;
    }
    ppTVar2 = std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::operator[]
                        (&this->TableInfoList,(long)local_24);
    _Var1 = std::operator==(&(*ppTVar2)->tableName,tableName);
    if (_Var1) break;
    local_24 = local_24 + 1;
  }
  return local_24;
}

Assistant:

int catalog::existTable(std::string tableName){
    for(int i = 0 ; i < tableNumber ; i++){
        // std::cout << "check "<<tableName<<std::endl;
        // std::cout << "find "<<TableInfoList[i]->tableName<<std::endl;
        if(TableInfoList[i]->tableName == tableName){
            return i;
        }
    }
    return -1;
}